

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_array.h
# Opt level: O1

StorageElement * __thiscall
absl::FixedArray<char,_18446744073709551615UL,_std::allocator<char>_>::Storage::InitializeData
          (Storage *this)

{
  ulong uVar1;
  StorageElement *pSVar2;
  
  uVar1 = (this->size_alloc_).
          super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_0UL,_false>.value;
  if (uVar1 < 0x101) {
    return (StorageElement *)this;
  }
  if (-1 < (long)uVar1) {
    pSVar2 = (StorageElement *)operator_new(uVar1);
    return pSVar2;
  }
  std::__throw_bad_alloc();
}

Assistant:

StorageElement* InitializeData() {
      if (UsingInlinedStorage(size())) {
        InlinedStorage::AnnotateConstruct(size());
        return InlinedStorage::data();
      } else {
        return reinterpret_cast<StorageElement*>(
            AllocatorTraits::allocate(alloc(), size()));
      }
    }